

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Scl_Pair_t Scl_LibertyUpdateHead(Scl_Tree_t *p,Scl_Pair_t Head)

{
  char *pcVar1;
  int iVar2;
  char *local_50;
  char *pChar;
  char *pLastNonSpace;
  char *pFirstNonSpace;
  char *pEnd;
  char *pBeg;
  Scl_Pair_t Res;
  Scl_Tree_t *p_local;
  Scl_Pair_t Head_local;
  
  p_local._0_4_ = Head.Beg;
  pcVar1 = p->pContents;
  p_local._4_4_ = Head.End;
  pLastNonSpace = (char *)0x0;
  pChar = (char *)0x0;
  for (local_50 = p->pContents + (int)p_local; local_50 < pcVar1 + p_local._4_4_;
      local_50 = local_50 + 1) {
    if (*local_50 == '\n') {
      p->nLines = p->nLines + 1;
    }
    iVar2 = Scl_LibertyCharIsSpace(*local_50);
    if ((iVar2 == 0) && (pChar = local_50, pLastNonSpace == (char *)0x0)) {
      pLastNonSpace = local_50;
    }
  }
  Head_local = Head;
  if ((pLastNonSpace != (char *)0x0) && (pChar != (char *)0x0)) {
    if ((pLastNonSpace == (char *)0x0) || (pChar == (char *)0x0)) {
      __assert_fail("pFirstNonSpace && pLastNonSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                    ,0x13b,"Scl_Pair_t Scl_LibertyUpdateHead(Scl_Tree_t *, Scl_Pair_t)");
    }
    Head_local.End = ((int)pChar - (int)p->pContents) + 1;
    Head_local.Beg = (int)pLastNonSpace - (int)p->pContents;
  }
  return Head_local;
}

Assistant:

static inline Scl_Pair_t Scl_LibertyUpdateHead( Scl_Tree_t * p, Scl_Pair_t Head )
{
    Scl_Pair_t Res;
    char * pBeg = p->pContents + Head.Beg;
    char * pEnd = p->pContents + Head.End;
    char * pFirstNonSpace = NULL;
    char * pLastNonSpace = NULL;
    char * pChar;
    for ( pChar = pBeg; pChar < pEnd; pChar++ )
    {
        if ( *pChar == '\n' )
            p->nLines++;
        if ( Scl_LibertyCharIsSpace(*pChar) )
            continue;
        pLastNonSpace = pChar;
        if ( pFirstNonSpace == NULL )
            pFirstNonSpace = pChar;
    }
    if ( pFirstNonSpace == NULL || pLastNonSpace == NULL )
        return Head;
    assert( pFirstNonSpace && pLastNonSpace );
    Res.Beg = pFirstNonSpace - p->pContents;
    Res.End = pLastNonSpace  - p->pContents + 1;
    return Res;
}